

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O0

void __thiscall cmDebugger::cmDebuggerPipeClient_POSIX::write(cmDebuggerPipeClient_POSIX *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((cmDebuggerPipeClient_POSIX *)&this[-1].rw_pipe,in_ESI,in_RDX,in_RCX);
  return;
}

Assistant:

bool cmDebuggerPipeClient_POSIX::write(void const* buffer, size_t n)
{
  int count = 0;
  if (isOpen()) {
    count = static_cast<int>(::write(rw_pipe, buffer, n));
    if (count < 0) {
      close();
    }
  }

  return count > 0;
}